

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryBase.hpp
# Opt level: O0

void __thiscall
Diligent::EngineFactoryBase<Diligent::IEngineFactoryVk>::CreateDataBlob
          (EngineFactoryBase<Diligent::IEngineFactoryVk> *this,size_t InitialSize,void *pData,
          IDataBlob **ppDataBlob)

{
  bool bVar1;
  DataBlobImpl *this_00;
  undefined1 local_30 [8];
  RefCntAutoPtr<Diligent::DataBlobImpl> pDataBlob;
  IDataBlob **ppDataBlob_local;
  void *pData_local;
  size_t InitialSize_local;
  EngineFactoryBase<Diligent::IEngineFactoryVk> *this_local;
  
  pDataBlob.m_pObject = (DataBlobImpl *)ppDataBlob;
  DataBlobImpl::Create((DataBlobImpl *)local_30,InitialSize,pData);
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)local_30);
  if (bVar1) {
    this_00 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                        ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_30);
    DataBlobImpl::QueryInterface
              (this_00,(INTERFACE_ID *)IID_DataBlob,(IObject **)pDataBlob.m_pObject);
  }
  RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_30);
  return;
}

Assistant:

CreateDataBlob(size_t InitialSize, const void* pData, IDataBlob** ppDataBlob) const override final
    {
        if (auto pDataBlob = DataBlobImpl::Create(InitialSize, pData))
            pDataBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppDataBlob));
    }